

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::ConstantPropagationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,ConstantPropagationCase *this,bool optimized)

{
  bool bVar1;
  CaseShaderType CVar2;
  CaseType CVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  ulong *puVar8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  pointer unaff_RBX;
  int iVar12;
  char *pcVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  string constMaybe;
  string precision;
  string statements;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  ulong *local_570;
  long local_568;
  ulong local_560;
  long lStack_558;
  long *local_550;
  undefined8 local_548;
  long local_540;
  undefined8 uStack_538;
  long *local_530;
  undefined8 local_528;
  long local_520;
  undefined8 uStack_518;
  ulong *local_510;
  long local_508;
  ulong local_500;
  long lStack_4f8;
  string local_4f0;
  long *local_4d0;
  undefined8 local_4c8;
  long local_4c0;
  undefined8 uStack_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  long *local_490;
  long local_488;
  long local_480;
  long lStack_478;
  string local_470;
  string local_450;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  long *local_410;
  long local_408;
  long local_400;
  long lStack_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  long *local_3d0;
  long local_3c8;
  long local_3c0;
  long lStack_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long lStack_398;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  string local_350;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  ProgramData *local_2d0;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  CVar2 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  if (CASESHADERTYPE_FRAGMENT < CVar2) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_012cbe81:
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    uVar7 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
      operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
    }
    if (local_5b0._M_dataplus._M_p != unaff_RBX) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,
                      CONCAT26(local_590.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_590.field_2._M_local_buf[5],
                                        CONCAT14(local_590.field_2._M_local_buf[4],
                                                 local_590.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar7);
  }
  local_590.field_2._M_local_buf[4] = 'p';
  local_590.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_590._M_string_length = 5;
  local_590.field_2._M_local_buf[5] = '\0';
  CVar3 = this->m_caseType;
  if (CVar3 == CASETYPE_STRUCT) {
    pcVar13 = "";
    if (this->m_useConstantExpressionsOnly != false) {
      pcVar13 = "const ";
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    pcVar11 = pcVar13 + 6;
    if (this->m_useConstantExpressionsOnly == false) {
      pcVar11 = pcVar13;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,pcVar13,pcVar11);
    iVar12 = 1;
    if (CVar2 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (optimized) {
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_1a8);
LAB_012c92f7:
      _Var15._M_p = local_1a8[0]._M_dataplus._M_p;
      local_4f0.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_4f0._M_dataplus._M_p = (pointer)paVar4;
      memcpy(paVar4,
             "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
             ,0xa5);
      local_4f0._M_string_length = (size_type)_Var15._M_p;
      paVar4->_M_local_buf[(long)_Var15._M_p] = '\0';
    }
    else {
      std::operator+(&local_310,"\tstruct S\n\t{\n\t\t",&local_590);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_350.field_2._M_allocated_capacity = *puVar8;
        local_350.field_2._8_8_ = plVar5[3];
      }
      else {
        local_350.field_2._M_allocated_capacity = *puVar8;
        local_350._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_350._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_350,(ulong)local_590._M_dataplus._M_p);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_288.field_2._M_allocated_capacity = *puVar8;
        local_288.field_2._8_8_ = plVar5[3];
      }
      else {
        local_288.field_2._M_allocated_capacity = *puVar8;
        local_288._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_288._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_490 = &local_480;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_480 = *plVar9;
        lStack_478 = plVar5[3];
      }
      else {
        local_480 = *plVar9;
        local_490 = (long *)*plVar5;
      }
      local_488 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_490,(ulong)local_590._M_dataplus._M_p);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470.field_2._8_8_ = plVar5[3];
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_470._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_470);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_450.field_2._M_allocated_capacity = *puVar8;
        local_450.field_2._8_8_ = plVar5[3];
      }
      else {
        local_450.field_2._M_allocated_capacity = *puVar8;
        local_450._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_450._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_450,(ulong)local_590._M_dataplus._M_p);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_4b0.field_2._M_allocated_capacity = *psVar10;
        local_4b0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_4b0.field_2._M_allocated_capacity = *psVar10;
        local_4b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_4b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
      local_4d0 = &local_4c0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_4c0 = *plVar5;
        uStack_4b8 = puVar6[3];
      }
      else {
        local_4c0 = *plVar5;
        local_4d0 = (long *)*puVar6;
      }
      local_4c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4d0,(ulong)local_5b0._M_dataplus._M_p);
      local_430 = &local_420;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_420 = *plVar9;
        lStack_418 = plVar5[3];
      }
      else {
        local_420 = *plVar9;
        local_430 = (long *)*plVar5;
      }
      local_428 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
      local_410 = &local_400;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_400 = *plVar9;
        lStack_3f8 = plVar5[3];
      }
      else {
        local_400 = *plVar9;
        local_410 = (long *)*plVar5;
      }
      local_408 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_410,(ulong)local_5b0._M_dataplus._M_p);
      local_3f0 = &local_3e0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3e0 = *plVar9;
        lStack_3d8 = plVar5[3];
      }
      else {
        local_3e0 = *plVar9;
        local_3f0 = (long *)*plVar5;
      }
      local_3e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3f0,(ulong)local_590._M_dataplus._M_p);
      local_3d0 = &local_3c0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3c0 = *plVar9;
        lStack_3b8 = plVar5[3];
      }
      else {
        local_3c0 = *plVar9;
        local_3d0 = (long *)*plVar5;
      }
      local_3c8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3d0);
      local_3b0 = &local_3a0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3a0 = *plVar9;
        lStack_398 = plVar5[3];
      }
      else {
        local_3a0 = *plVar9;
        local_3b0 = (long *)*plVar5;
      }
      local_3a8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3b0,(ulong)local_5b0._M_dataplus._M_p);
      local_390 = &local_380;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_380 = *plVar9;
        lStack_378 = plVar5[3];
      }
      else {
        local_380 = *plVar9;
        local_390 = (long *)*plVar5;
      }
      local_388 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_590._M_dataplus._M_p);
      local_370 = &local_360;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_360 = *plVar9;
        lStack_358 = plVar5[3];
      }
      else {
        local_360 = *plVar9;
        local_370 = (long *)*plVar5;
      }
      local_368 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_370);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_560 = *puVar8;
        lStack_558 = plVar5[3];
        local_570 = &local_560;
      }
      else {
        local_560 = *puVar8;
        local_570 = (ulong *)*plVar5;
      }
      local_568 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_228,"\t",&local_5b0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_228,(ulong)local_590._M_dataplus._M_p);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_248.field_2._M_allocated_capacity = *puVar8;
        local_248.field_2._8_8_ = plVar5[3];
      }
      else {
        local_248.field_2._M_allocated_capacity = *puVar8;
        local_248._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_248._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_248);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208.field_2._8_8_ = plVar5[3];
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_208._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      repeatIndexedTemplate(&local_268,&local_208,iVar12,&local_1c8,1);
      uVar14 = 0xf;
      if (local_570 != &local_560) {
        uVar14 = local_560;
      }
      if (uVar14 < local_268._M_string_length + local_568) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          uVar7 = local_268.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_268._M_string_length + local_568) goto LAB_012ca74f;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_570);
      }
      else {
LAB_012ca74f:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_570,(ulong)local_268._M_dataplus._M_p);
      }
      local_550 = &local_540;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_540 = *plVar5;
        uStack_538 = puVar6[3];
      }
      else {
        local_540 = *plVar5;
        local_550 = (long *)*puVar6;
      }
      local_548 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_550);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_320 = *plVar9;
        lStack_318 = plVar5[3];
        local_330 = &local_320;
      }
      else {
        local_320 = *plVar9;
        local_330 = (long *)*plVar5;
      }
      local_328 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_330,(ulong)local_5b0._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2e0 = *plVar9;
        lStack_2d8 = plVar5[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *plVar9;
        local_2f0 = (long *)*plVar5;
      }
      local_2e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_2d0 = __return_storage_ptr__;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_590._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2b8 = *plVar9;
        lStack_2b0 = plVar5[3];
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8 = *plVar9;
        local_2c8 = (long *)*plVar5;
      }
      local_2c0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_500 = *puVar8;
        lStack_4f8 = plVar5[3];
        local_510 = &local_500;
      }
      else {
        local_500 = *puVar8;
        local_510 = (ulong *)*plVar5;
      }
      local_508 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar14 = 0xf;
      if (local_510 != &local_500) {
        uVar14 = local_500;
      }
      if (uVar14 < (ulong)(local_1e0 + local_508)) {
        uVar14 = 0xf;
        if (local_1e8 != local_1d8) {
          uVar14 = local_1d8[0];
        }
        if (uVar14 < (ulong)(local_1e0 + local_508)) goto LAB_012caf62;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_510);
      }
      else {
LAB_012caf62:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_510,(ulong)local_1e8);
      }
      local_530 = &local_520;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_520 = *plVar5;
        uStack_518 = puVar6[3];
      }
      else {
        local_520 = *plVar5;
        local_530 = (long *)*puVar6;
      }
      local_528 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_530);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar5[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar5;
      }
      local_2a0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      plVar5 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar5) {
        local_4f0.field_2._M_allocated_capacity = *plVar5;
        local_4f0.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4f0.field_2._M_allocated_capacity = *plVar5;
        local_4f0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4f0._M_string_length = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520 + 1);
      }
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      if (local_510 != &local_500) {
        operator_delete(local_510,local_500 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0 + 1);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,local_320 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_370 != &local_360) {
        operator_delete(local_370,local_360 + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if (local_3b0 != &local_3a0) {
        operator_delete(local_3b0,local_3a0 + 1);
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,local_3c0 + 1);
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,local_4c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_2d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      uVar7 = local_310.field_2._M_allocated_capacity;
      _Var15._M_p = local_310._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) goto LAB_012cbdb3;
    }
LAB_012cbdbb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_012cbdd2;
  }
  else {
    if (CVar3 != CASETYPE_ARRAY) {
      if (CVar3 != CASETYPE_BUILT_IN_FUNCTIONS) goto LAB_012cbe81;
      pcVar13 = "";
      if (this->m_useConstantExpressionsOnly != false) {
        pcVar13 = "const ";
      }
      local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
      pcVar11 = pcVar13 + 6;
      if (this->m_useConstantExpressionsOnly == false) {
        pcVar11 = pcVar13;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,pcVar13,pcVar11);
      iVar12 = 1;
      if (CVar2 == CASESHADERTYPE_VERTEX) {
        iVar12 = 0xc;
      }
      if (optimized) {
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_1a8);
        goto LAB_012c92f7;
      }
      std::operator+(&local_288,"\t",&local_5b0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_288,(ulong)local_590._M_dataplus._M_p);
      local_490 = &local_480;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_480 = *plVar9;
        lStack_478 = plVar5[3];
      }
      else {
        local_480 = *plVar9;
        local_490 = (long *)*plVar5;
      }
      local_488 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470.field_2._8_8_ = plVar5[3];
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_470._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_470,(ulong)local_5b0._M_dataplus._M_p);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_450.field_2._M_allocated_capacity = *puVar8;
        local_450.field_2._8_8_ = plVar5[3];
      }
      else {
        local_450.field_2._M_allocated_capacity = *puVar8;
        local_450._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_450._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_450,(ulong)local_590._M_dataplus._M_p);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_4b0.field_2._M_allocated_capacity = *psVar10;
        local_4b0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_4b0.field_2._M_allocated_capacity = *psVar10;
        local_4b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_4b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
      local_4d0 = &local_4c0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_4c0 = *plVar5;
        uStack_4b8 = puVar6[3];
      }
      else {
        local_4c0 = *plVar5;
        local_4d0 = (long *)*puVar6;
      }
      local_4c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_4d0,(ulong)local_5b0._M_dataplus._M_p);
      local_430 = &local_420;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_420 = *plVar9;
        lStack_418 = plVar5[3];
      }
      else {
        local_420 = *plVar9;
        local_430 = (long *)*plVar5;
      }
      local_428 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
      local_410 = &local_400;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_400 = *plVar9;
        lStack_3f8 = plVar5[3];
      }
      else {
        local_400 = *plVar9;
        local_410 = (long *)*plVar5;
      }
      local_408 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_410,(ulong)local_5b0._M_dataplus._M_p);
      local_3f0 = &local_3e0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3e0 = *plVar9;
        lStack_3d8 = plVar5[3];
      }
      else {
        local_3e0 = *plVar9;
        local_3f0 = (long *)*plVar5;
      }
      local_3e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3f0,(ulong)local_590._M_dataplus._M_p);
      local_3d0 = &local_3c0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3c0 = *plVar9;
        lStack_3b8 = plVar5[3];
      }
      else {
        local_3c0 = *plVar9;
        local_3d0 = (long *)*plVar5;
      }
      local_3c8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3d0);
      local_3b0 = &local_3a0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3a0 = *plVar9;
        lStack_398 = plVar5[3];
      }
      else {
        local_3a0 = *plVar9;
        local_3b0 = (long *)*plVar5;
      }
      local_3a8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3b0,(ulong)local_5b0._M_dataplus._M_p);
      local_390 = &local_380;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_380 = *plVar9;
        lStack_378 = plVar5[3];
      }
      else {
        local_380 = *plVar9;
        local_390 = (long *)*plVar5;
      }
      local_388 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_590._M_dataplus._M_p);
      local_370 = &local_360;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_360 = *plVar9;
        lStack_358 = plVar5[3];
      }
      else {
        local_360 = *plVar9;
        local_370 = (long *)*plVar5;
      }
      local_368 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_370);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_560 = *puVar8;
        lStack_558 = plVar5[3];
        local_570 = &local_560;
      }
      else {
        local_560 = *puVar8;
        local_570 = (ulong *)*plVar5;
      }
      local_568 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_208,"\t",&local_5b0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_208,(ulong)local_590._M_dataplus._M_p);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_268.field_2._M_allocated_capacity = *puVar8;
        local_268.field_2._8_8_ = plVar5[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *puVar8;
        local_268._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_268._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_310.field_2._M_allocated_capacity = *puVar8;
        local_310.field_2._8_8_ = plVar5[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *puVar8;
        local_310._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_310._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_allocated_capacity =
           local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
      repeatIndexedTemplate(&local_350,&local_310,iVar12,&local_248,1);
      uVar14 = 0xf;
      if (local_570 != &local_560) {
        uVar14 = local_560;
      }
      if (uVar14 < local_350._M_string_length + local_568) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          uVar7 = local_350.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_350._M_string_length + local_568) goto LAB_012ca639;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_570);
      }
      else {
LAB_012ca639:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_570,(ulong)local_350._M_dataplus._M_p);
      }
      local_550 = &local_540;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_540 = *plVar5;
        uStack_538 = puVar6[3];
      }
      else {
        local_540 = *plVar5;
        local_550 = (long *)*puVar6;
      }
      local_548 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_550);
      local_330 = &local_320;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_320 = *plVar9;
        lStack_318 = plVar5[3];
      }
      else {
        local_320 = *plVar9;
        local_330 = (long *)*plVar5;
      }
      local_328 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_330,(ulong)local_5b0._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2e0 = *plVar9;
        lStack_2d8 = plVar5[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *plVar9;
        local_2f0 = (long *)*plVar5;
      }
      local_2e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_590._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2b8 = *plVar9;
        lStack_2b0 = plVar5[3];
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8 = *plVar9;
        local_2c8 = (long *)*plVar5;
      }
      local_2c0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_500 = *puVar8;
        lStack_4f8 = plVar5[3];
        local_510 = &local_500;
      }
      else {
        local_500 = *puVar8;
        local_510 = (ulong *)*plVar5;
      }
      local_508 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar14 = 0xf;
      if (local_510 != &local_500) {
        uVar14 = local_500;
      }
      if (uVar14 < local_228._M_string_length + local_508) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          uVar7 = local_228.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_228._M_string_length + local_508) goto LAB_012caca9;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_510);
      }
      else {
LAB_012caca9:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_510,(ulong)local_228._M_dataplus._M_p);
      }
      local_530 = &local_520;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_520 = *plVar5;
        uStack_518 = puVar6[3];
      }
      else {
        local_520 = *plVar5;
        local_530 = (long *)*puVar6;
      }
      local_528 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_530);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar5[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar5;
      }
      local_2a0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      plVar5 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar5) {
        local_4f0.field_2._M_allocated_capacity = *plVar5;
        local_4f0.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4f0.field_2._M_allocated_capacity = *plVar5;
        local_4f0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4f0._M_string_length = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (local_510 != &local_500) {
        operator_delete(local_510,local_500 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0 + 1);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,local_320 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_370 != &local_360) {
        operator_delete(local_370,local_360 + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if (local_3b0 != &local_3a0) {
        operator_delete(local_3b0,local_3a0 + 1);
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,local_3c0 + 1);
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,local_4c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      uVar7 = local_288.field_2._M_allocated_capacity;
      _Var15._M_p = local_288._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
LAB_012cbdb3:
        operator_delete(_Var15._M_p,uVar7 + 1);
      }
      goto LAB_012cbdbb;
    }
    bVar1 = this->m_useConstantExpressionsOnly;
    pcVar13 = "";
    if (bVar1 != false) {
      pcVar13 = "const ";
    }
    pcVar11 = pcVar13 + 6;
    if (bVar1 == false) {
      pcVar11 = pcVar13;
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,pcVar13,pcVar11);
    iVar12 = 1;
    if (CVar2 == CASESHADERTYPE_VERTEX) {
      iVar12 = 0xc;
    }
    if (optimized) {
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_4f0,(ulong)local_1a8);
      _Var15._M_p = local_1a8[0]._M_dataplus._M_p;
      local_4f0.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_4f0._M_dataplus._M_p = (pointer)paVar4;
      memcpy(paVar4,
             "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
             ,0xa5);
      local_4f0._M_string_length = (size_type)_Var15._M_p;
      paVar4->_M_local_buf[(long)_Var15._M_p] = '\0';
    }
    else {
      if (bVar1 == false) {
        std::operator+(&local_4b0,"\t",&local_590);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
      }
      else {
        std::operator+(&local_4b0,"\tconst ",&local_590);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
      }
      local_4d0 = &local_4c0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_4c0 = *plVar5;
        uStack_4b8 = puVar6[3];
      }
      else {
        local_4c0 = *plVar5;
        local_4d0 = (long *)*puVar6;
      }
      local_4c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      local_2d0 = (ProgramData *)CONCAT71(local_2d0._1_7_,bVar1);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_4d0,0,(char *)0x0,0x1c1b76e);
      local_430 = &local_420;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_420 = *plVar9;
        lStack_418 = plVar5[3];
      }
      else {
        local_420 = *plVar9;
        local_430 = (long *)*plVar5;
      }
      local_428 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_430);
      local_410 = &local_400;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_400 = *plVar9;
        lStack_3f8 = plVar5[3];
      }
      else {
        local_400 = *plVar9;
        local_410 = (long *)*plVar5;
      }
      local_408 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_410,(ulong)local_5b0._M_dataplus._M_p);
      local_3f0 = &local_3e0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3e0 = *plVar9;
        lStack_3d8 = plVar5[3];
      }
      else {
        local_3e0 = *plVar9;
        local_3f0 = (long *)*plVar5;
      }
      local_3e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3f0,(ulong)local_590._M_dataplus._M_p);
      local_3d0 = &local_3c0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3c0 = *plVar9;
        lStack_3b8 = plVar5[3];
      }
      else {
        local_3c0 = *plVar9;
        local_3d0 = (long *)*plVar5;
      }
      local_3c8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_3d0);
      local_3b0 = &local_3a0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_3a0 = *plVar9;
        lStack_398 = plVar5[3];
      }
      else {
        local_3a0 = *plVar9;
        local_3b0 = (long *)*plVar5;
      }
      local_3a8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3b0,(ulong)local_5b0._M_dataplus._M_p);
      local_390 = &local_380;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_380 = *plVar9;
        lStack_378 = plVar5[3];
      }
      else {
        local_380 = *plVar9;
        local_390 = (long *)*plVar5;
      }
      local_388 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_590._M_dataplus._M_p);
      local_370 = &local_360;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_360 = *plVar9;
        lStack_358 = plVar5[3];
      }
      else {
        local_360 = *plVar9;
        local_370 = (long *)*plVar5;
      }
      local_368 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_370);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_560 = *puVar8;
        lStack_558 = plVar5[3];
        local_570 = &local_560;
      }
      else {
        local_560 = *puVar8;
        local_570 = (ulong *)*plVar5;
      }
      local_568 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::operator+(&local_288,"\t",&local_5b0);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_288,(ulong)local_590._M_dataplus._M_p);
      local_490 = &local_480;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_480 = *plVar9;
        lStack_478 = plVar5[3];
      }
      else {
        local_480 = *plVar9;
        local_490 = (long *)*plVar5;
      }
      local_488 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470.field_2._8_8_ = plVar5[3];
      }
      else {
        local_470.field_2._M_allocated_capacity = *psVar10;
        local_470._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_470._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      local_350._M_string_length = 0;
      local_350.field_2._M_allocated_capacity =
           local_350.field_2._M_allocated_capacity & 0xffffffffffffff00;
      repeatIndexedTemplate(&local_450,&local_470,iVar12,&local_350,1);
      uVar14 = 0xf;
      if (local_570 != &local_560) {
        uVar14 = local_560;
      }
      if (uVar14 < local_450._M_string_length + local_568) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          uVar7 = local_450.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_450._M_string_length + local_568) goto LAB_012ca29a;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_450,0,(char *)0x0,(ulong)local_570);
      }
      else {
LAB_012ca29a:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_570,(ulong)local_450._M_dataplus._M_p);
      }
      local_550 = &local_540;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_540 = *plVar5;
        uStack_538 = puVar6[3];
      }
      else {
        local_540 = *plVar5;
        local_550 = (long *)*puVar6;
      }
      local_548 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_550);
      local_330 = &local_320;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_320 = *plVar9;
        lStack_318 = plVar5[3];
      }
      else {
        local_320 = *plVar9;
        local_330 = (long *)*plVar5;
      }
      local_328 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_330,(ulong)local_5b0._M_dataplus._M_p);
      local_2f0 = &local_2e0;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2e0 = *plVar9;
        lStack_2d8 = plVar5[3];
      }
      else {
        local_2e0 = *plVar9;
        local_2f0 = (long *)*plVar5;
      }
      local_2e8 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_590._M_dataplus._M_p);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_2b8 = *plVar9;
        lStack_2b0 = plVar5[3];
        local_2c8 = &local_2b8;
      }
      else {
        local_2b8 = *plVar9;
        local_2c8 = (long *)*plVar5;
      }
      local_2c0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_500 = *puVar8;
        lStack_4f8 = plVar5[3];
        local_510 = &local_500;
      }
      else {
        local_500 = *puVar8;
        local_510 = (ulong *)*plVar5;
      }
      local_508 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar12);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar14 = 0xf;
      if (local_510 != &local_500) {
        uVar14 = local_500;
      }
      if (uVar14 < local_310._M_string_length + local_508) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          uVar7 = local_310.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_310._M_string_length + local_508) goto LAB_012ca9f8;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_510);
      }
      else {
LAB_012ca9f8:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_510,(ulong)local_310._M_dataplus._M_p);
      }
      local_530 = &local_520;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_520 = *plVar5;
        uStack_518 = puVar6[3];
      }
      else {
        local_520 = *plVar5;
        local_530 = (long *)*puVar6;
      }
      local_528 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_530);
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar5[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar5;
      }
      local_2a0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      plVar9 = plVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar9) {
        local_4f0.field_2._M_allocated_capacity = *plVar9;
        local_4f0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_4f0.field_2._M_allocated_capacity = *plVar9;
        local_4f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_4f0._M_string_length = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298 + 1);
      }
      if (local_530 != &local_520) {
        operator_delete(local_530,local_520 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      if (local_510 != &local_500) {
        operator_delete(local_510,local_500 + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0 + 1);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330,local_320 + 1);
      }
      if (local_550 != &local_540) {
        operator_delete(local_550,local_540 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if (local_490 != &local_480) {
        operator_delete(local_490,local_480 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_570 != &local_560) {
        operator_delete(local_570,local_560 + 1);
      }
      if (local_370 != &local_360) {
        operator_delete(local_370,local_360 + 1);
      }
      if (local_390 != &local_380) {
        operator_delete(local_390,local_380 + 1);
      }
      if (local_3b0 != &local_3a0) {
        operator_delete(local_3b0,local_3a0 + 1);
      }
      if (local_3d0 != &local_3c0) {
        operator_delete(local_3d0,local_3c0 + 1);
      }
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      if (local_410 != &local_400) {
        operator_delete(local_410,local_400 + 1);
      }
      if (local_430 != &local_420) {
        operator_delete(local_430,local_420 + 1);
      }
      if (local_4d0 != &local_4c0) {
        operator_delete(local_4d0,local_4c0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) goto LAB_012cbdd2;
  }
  operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
LAB_012cbdd2:
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,(ulong)(local_4f0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT26(local_590.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_590.field_2._M_local_buf[5],
                                      CONCAT14(local_590.field_2._M_local_buf[4],
                                               local_590.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_BUILT_IN_FUNCTIONS		? builtinFunctionsCaseStatements	(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_ARRAY					? arrayCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_STRUCT					? structCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}